

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O1

void __thiscall CompressedArray::add_key(CompressedArray *this,Key key,Key prev_key,bool same_word)

{
  undefined3 in_register_00000009;
  uint32_t log_radix;
  uint32_t number;
  
  number = key.context_index;
  if (CONCAT31(in_register_00000009,same_word) == 0) {
    add_number(this,key.word_index - prev_key.word_index,this->word_index_diff_log_radix);
  }
  if (key.word_index == prev_key.word_index) {
    number = number - prev_key.context_index;
    log_radix = this->context_index_diff_log_radix;
  }
  else {
    log_radix = this->context_index_log_radix;
  }
  add_number(this,number,log_radix);
  return;
}

Assistant:

void CompressedArray::add_key(Key key, Key prev_key, bool same_word) {
    if (!same_word)
        add_number(key.word_index - prev_key.word_index, word_index_diff_log_radix);
    if (key.word_index != prev_key.word_index)
        add_number(key.context_index, context_index_log_radix);
    else
        add_number(key.context_index - prev_key.context_index, context_index_diff_log_radix);
}